

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

void nfa_closure(DFAState *x)

{
  uint uVar1;
  NFAState *pNVar2;
  NFAState *pNVar3;
  NFAState *s;
  uint local_18;
  uint k;
  uint j;
  uint i;
  DFAState *x_local;
  
  k = 0;
  do {
    if ((x->states).n <= k) {
      if ((x->states).v != (NFAState **)0x0) {
        qsort((x->states).v,(ulong)(x->states).n,8,nfacmp);
      }
      return;
    }
    pNVar2 = (x->states).v[k];
    for (local_18 = 0; local_18 < ((x->states).v[k]->epsilon).n; local_18 = local_18 + 1) {
      for (s._4_4_ = 0; s._4_4_ < (x->states).n; s._4_4_ = s._4_4_ + 1) {
        if (((x->states).v[k]->epsilon).v[local_18] == (x->states).v[s._4_4_]) goto LAB_00149736;
      }
      if ((x->states).v == (NFAState **)0x0) {
        pNVar3 = (pNVar2->epsilon).v[local_18];
        (x->states).v = (x->states).e;
        uVar1 = (x->states).n;
        (x->states).n = uVar1 + 1;
        (x->states).e[uVar1] = pNVar3;
      }
      else if ((x->states).v == (x->states).e) {
        if ((x->states).n < 3) {
          pNVar3 = (pNVar2->epsilon).v[local_18];
          uVar1 = (x->states).n;
          (x->states).n = uVar1 + 1;
          (x->states).v[uVar1] = pNVar3;
        }
        else {
LAB_00149717:
          vec_add_internal(x,(pNVar2->epsilon).v[local_18]);
        }
      }
      else {
        if (((x->states).n & 7) == 0) goto LAB_00149717;
        pNVar3 = (pNVar2->epsilon).v[local_18];
        uVar1 = (x->states).n;
        (x->states).n = uVar1 + 1;
        (x->states).v[uVar1] = pNVar3;
      }
LAB_00149736:
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void nfa_closure(DFAState *x) {
  uint i, j, k;

  for (i = 0; i < x->states.n; i++) {
    NFAState *s = x->states.v[i];
    for (j = 0; j < x->states.v[i]->epsilon.n; j++) {
      for (k = 0; k < x->states.n; k++)
        if (x->states.v[i]->epsilon.v[j] == x->states.v[k]) goto Lbreak;
      vec_add(&x->states, s->epsilon.v[j]);
    Lbreak:;
    }
  }
  if (x->states.v != NULL) qsort(x->states.v, x->states.n, sizeof(x->states.v[0]), nfacmp);
}